

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O2

void __thiscall QFileSystemComboBox::setCurrentFilePath(QFileSystemComboBox *this,QString *filePath)

{
  QFileSystemComboBoxPrivate *this_00;
  bool bVar1;
  QFileInfo fileInfo;
  undefined1 local_60 [24];
  QArrayDataPointer<char16_t> local_48;
  undefined4 local_30 [2];
  QFileInfo local_28 [8];
  
  QFileInfo::QFileInfo(&fileInfo,(QString *)filePath);
  rootPath((QString *)local_60,this);
  QFileInfo::absolutePath();
  bVar1 = operator!=((QString *)local_60,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_60);
  this_00 = this->d;
  if (bVar1) {
    QFileInfo::absolutePath();
    local_30[0] = 0xffffffff;
    QFileInfo::QFileInfo(local_28,&fileInfo);
    std::_Optional_payload_base<std::pair<int,QFileInfo>>::
    _Optional_payload_base<std::pair<int,QFileInfo>>
              ((_Optional_payload_base<std::pair<int,QFileInfo>> *)&local_48,local_30);
    QFileSystemComboBoxPrivate::setRootPath(this_00,(QString *)local_60,(LayoutValue *)&local_48);
    std::_Optional_payload_base<std::pair<int,_QFileInfo>_>::_M_reset
              ((_Optional_payload_base<std::pair<int,_QFileInfo>_> *)&local_48);
    QFileInfo::~QFileInfo(local_28);
  }
  else {
    if ((this_00->initialSorting != false) ||
       ((this_00->layoutValue).super__Optional_base<std::pair<int,_QFileInfo>,_false,_false>.
        _M_payload.super__Optional_payload<std::pair<int,_QFileInfo>,_true,_false,_false>.
        super__Optional_payload_base<std::pair<int,_QFileInfo>_>._M_engaged == true)) {
      local_60._0_4_ = -1;
      QFileInfo::QFileInfo((QFileInfo *)(local_60 + 8),&fileInfo);
      std::optional<std::pair<int,QFileInfo>>::operator=
                ((optional<std::pair<int,QFileInfo>> *)&this->d->layoutValue,
                 (pair<int,_QFileInfo> *)local_60);
      QFileInfo::~QFileInfo((QFileInfo *)(local_60 + 8));
      goto LAB_0019d4d0;
    }
    QFileInfo::fileName();
    findFileName(this,(QString *)local_60,(MatchFlags)0x10);
    QComboBox::setCurrentIndex((int)this);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_60);
LAB_0019d4d0:
  QFileInfo::~QFileInfo(&fileInfo);
  return;
}

Assistant:

void QFileSystemComboBox::setCurrentFilePath(const QString &filePath) {
    const QFileInfo fileInfo(filePath);

    if (rootPath() != fileInfo.absolutePath()) {
        d->setRootPath(fileInfo.absolutePath(), qMakePair(-1, fileInfo));
    } else {
        if (d->initialSorting || d->layoutValue) {
            d->layoutValue = qMakePair(-1, fileInfo);
        } else {
            setCurrentIndex(findFileName(fileInfo.fileName()));
        }
    }
}